

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToHalfPass::ProcessDefault(ConvertToHalfPass *this,Instruction *inst)

{
  Instruction *this_00;
  Op OVar1;
  DefUseManager *this_01;
  anon_class_24_3_647bfbe2 local_60;
  function<void_(unsigned_int_*)> local_48;
  bool local_21;
  Instruction *pIStack_20;
  bool modified;
  Instruction *inst_local;
  ConvertToHalfPass *this_local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)this;
  OVar1 = opt::Instruction::opcode(inst);
  this_00 = pIStack_20;
  if (OVar1 == OpPhi) {
    this_local._7_1_ = ProcessPhi(this,pIStack_20,0x10,0x20);
  }
  else {
    local_21 = false;
    local_60.inst = &stack0xffffffffffffffe0;
    local_60.modified = &local_21;
    local_60.this = this;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::ConvertToHalfPass::ProcessDefault(spvtools::opt::Instruction*)::__0,void>
              ((function<void(unsigned_int*)> *)&local_48,&local_60);
    opt::Instruction::ForEachInId(this_00,&local_48);
    std::function<void_(unsigned_int_*)>::~function(&local_48);
    if ((local_21 & 1U) != 0) {
      this_01 = Pass::get_def_use_mgr(&this->super_Pass);
      analysis::DefUseManager::AnalyzeInstUse(this_01,pIStack_20);
    }
    this_local._7_1_ = (bool)(local_21 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ConvertToHalfPass::ProcessDefault(Instruction* inst) {
  // If non-relaxed instruction has changed operands, need to convert
  // them back to float32
  if (inst->opcode() == spv::Op::OpPhi) return ProcessPhi(inst, 16u, 32u);
  bool modified = false;
  inst->ForEachInId([&inst, &modified, this](uint32_t* idp) {
    if (converted_ids_.count(*idp) == 0) return;
    uint32_t old_id = *idp;
    GenConvert(idp, 32, inst);
    if (*idp != old_id) modified = true;
  });
  if (modified) get_def_use_mgr()->AnalyzeInstUse(inst);
  return modified;
}